

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O2

string * __thiscall
duckdb_httplib::to_string_abi_cxx11_
          (string *__return_storage_ptr__,duckdb_httplib *this,Error error)

{
  char *pcVar1;
  allocator local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar1 = "Success (no error)";
    break;
  case 1:
    pcVar1 = "Unknown";
    break;
  case 2:
    pcVar1 = "Could not establish connection";
    break;
  case 3:
    pcVar1 = "Failed to bind IP address";
    break;
  case 4:
    pcVar1 = "Failed to read connection";
    break;
  case 5:
    pcVar1 = "Failed to write connection";
    break;
  case 6:
    pcVar1 = "Maximum redirect count exceeded";
    break;
  case 7:
    pcVar1 = "Connection handling canceled";
    break;
  case 8:
    pcVar1 = "SSL connection failed";
    break;
  case 9:
    pcVar1 = "SSL certificate loading failed";
    break;
  case 10:
    pcVar1 = "SSL server verification failed";
    break;
  case 0xb:
    pcVar1 = "Unsupported HTTP multipart boundary characters";
    break;
  case 0xc:
    pcVar1 = "Compression failed";
    break;
  case 0xd:
    pcVar1 = "Connection timed out";
    break;
  case 0xe:
    pcVar1 = "Proxy connection failed";
    break;
  default:
    pcVar1 = "Invalid";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string(const Error error) {
  switch (error) {
  case Error::Success: return "Success (no error)";
  case Error::Connection: return "Could not establish connection";
  case Error::BindIPAddress: return "Failed to bind IP address";
  case Error::Read: return "Failed to read connection";
  case Error::Write: return "Failed to write connection";
  case Error::ExceedRedirectCount: return "Maximum redirect count exceeded";
  case Error::Canceled: return "Connection handling canceled";
  case Error::SSLConnection: return "SSL connection failed";
  case Error::SSLLoadingCerts: return "SSL certificate loading failed";
  case Error::SSLServerVerification: return "SSL server verification failed";
  case Error::UnsupportedMultipartBoundaryChars:
    return "Unsupported HTTP multipart boundary characters";
  case Error::Compression: return "Compression failed";
  case Error::ConnectionTimeout: return "Connection timed out";
  case Error::ProxyConnection: return "Proxy connection failed";
  case Error::Unknown: return "Unknown";
  default: break;
  }

  return "Invalid";
}